

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O2

void __thiscall
polyscope::CurveNetwork::fillEdgeGeometryBuffers(CurveNetwork *this,ShaderProgram *program)

{
  undefined1 *indices;
  bool bVar1;
  CurveNetworkNodeScalarQuantity *pCVar2;
  ManagedBuffer<float> *indices_00;
  allocator local_e9;
  undefined1 local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b8 [48];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string(local_48,"a_position_tail",&local_e9);
  indices = &(this->super_QuantityStructure<polyscope::CurveNetwork>).field_0x428;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_b8,
             (ManagedBuffer<unsigned_int> *)indices);
  (*program->_vptr_ShaderProgram[0x13])(program,local_48,local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string(local_68,"a_position_tip",&local_e9);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)(local_d8 + 0x10),
             (ManagedBuffer<unsigned_int> *)indices);
  (*program->_vptr_ShaderProgram[0x13])(program,local_68,local_d8 + 0x10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::__cxx11::string::~string(local_68);
  bVar1 = std::operator!=(&this->nodeRadiusQuantityName,"");
  if (bVar1) {
    pCVar2 = resolveNodeRadiusQuantity(this);
    std::__cxx11::string::string(local_88,"a_tailRadius",&local_e9);
    indices_00 = &(pCVar2->super_CurveNetworkScalarQuantity).
                  super_ScalarQuantity<polyscope::CurveNetworkScalarQuantity>.values;
    render::ManagedBuffer<float>::getIndexedRenderAttributeBuffer
              ((ManagedBuffer<float> *)local_d8,(ManagedBuffer<unsigned_int> *)indices_00);
    (*program->_vptr_ShaderProgram[0x13])(program,local_88,local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::string((string *)(local_b8 + 0x10),"a_tipRadius",&local_e9);
    render::ManagedBuffer<float>::getIndexedRenderAttributeBuffer
              ((ManagedBuffer<float> *)local_e8,(ManagedBuffer<unsigned_int> *)indices_00);
    (*program->_vptr_ShaderProgram[0x13])(program,local_b8 + 0x10,local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
    std::__cxx11::string::~string((string *)(local_b8 + 0x10));
  }
  return;
}

Assistant:

void CurveNetwork::fillEdgeGeometryBuffers(render::ShaderProgram& program) {
  program.setAttribute("a_position_tail", nodePositions.getIndexedRenderAttributeBuffer(edgeTailInds));
  program.setAttribute("a_position_tip", nodePositions.getIndexedRenderAttributeBuffer(edgeTipInds));

  if (nodeRadiusQuantityName != "") {
    CurveNetworkNodeScalarQuantity& nodeRadQ = resolveNodeRadiusQuantity();
    program.setAttribute("a_tailRadius", nodeRadQ.values.getIndexedRenderAttributeBuffer(edgeTailInds));
    program.setAttribute("a_tipRadius", nodeRadQ.values.getIndexedRenderAttributeBuffer(edgeTipInds));
  }
}